

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O0

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
          (task_pool *this,lzcompressor *pObject,offset_in_lzcompressor_to_subr pObject_method,
          uint64 first_data,uint num_tasks,void *pData_ptr)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  long in_R8;
  int in_R9D;
  object_task_flags *in_stack_00000008;
  task tsk;
  int i;
  uint total_to_release;
  bool status;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  tsstack<lzham::task_pool::task,_64U> *in_stack_ffffffffffffff90;
  object_task_flags *in_stack_ffffffffffffff98;
  anon_union_8_2_408cf123_for_task_2 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar3;
  undefined3 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  byte bVar5;
  bool local_1;
  
  if (in_R9D == 0) {
    local_1 = true;
  }
  else {
    uVar4 = CONCAT13(1,in_stack_ffffffffffffffb8);
    uVar3 = 0;
    for (iVar2 = in_R9D + -1; -1 < iVar2; iVar2 = iVar2 + -1) {
      task::task((task *)&stack0xffffffffffffff90);
      in_stack_ffffffffffffff8c = 1;
      in_stack_ffffffffffffffa0.m_callback =
           (task_callback_func)
           lzham_new<lzham::object_task<lzham::lzcompressor>,void*,lzham::lzcompressor*,void(lzham::lzcompressor::*)(unsigned_long_long,void*),lzham::object_task_flags>
                     ((lzham_malloc_context)CONCAT44(in_R9D,uVar4),(void **)CONCAT44(uVar3,iVar2),
                      (lzcompressor **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                      ,in_stack_ffffffffffffffa0.m_callback,in_stack_ffffffffffffff98);
      if ((object_task<lzham::lzcompressor> *)in_stack_ffffffffffffffa0.m_callback ==
          (object_task<lzham::lzcompressor> *)0x0) {
        uVar4 = 0;
        break;
      }
      in_stack_ffffffffffffff90 = (tsstack<lzham::task_pool::task,_64U> *)(in_R8 + iVar2);
      in_stack_ffffffffffffffa8 = 1;
      in_stack_ffffffffffffff98 = in_stack_00000008;
      bVar1 = tsstack<lzham::task_pool::task,_64U>::try_push
                        (in_stack_ffffffffffffff90,
                         (task *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (!bVar1) {
        uVar4 = 0;
        break;
      }
      uVar3 = uVar3 + 1;
    }
    bVar5 = (byte)((uint)uVar4 >> 0x18);
    if (uVar3 != 0) {
      atomic_add32((atomic32_t *)(in_RDI + 0xa40),(ulong)uVar3);
      semaphore::release((semaphore *)in_stack_ffffffffffffff90,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    local_1 = (bool)(bVar5 & 1);
  }
  return local_1;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint total_to_release = 0;

      for (int i = num_tasks - 1; i >= 0; --i)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(m_malloc_context, m_malloc_context, pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }

         total_to_release++;
      }

      if (total_to_release)
      {
         atomic_add32(&m_num_outstanding_tasks, total_to_release);

         m_tasks_available.release(total_to_release);
      }

      return status;
   }